

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_dynlight.h
# Opt level: O2

void __thiscall ADynamicLight::UpdateLocation(ADynamicLight *this)

{
  TObjPtr<AActor> *obj;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  AActor *pAVar10;
  AActor *this_00;
  subsector_t *psVar11;
  int iVar12;
  float fVar13;
  DVector3 pos;
  DVector2 local_48;
  DVector3 local_38;
  
  if (((this->super_AActor).flags2.Value & 0x10000000) == 0) {
    dVar1 = (this->super_AActor).__Pos.X;
    dVar2 = (this->super_AActor).__Pos.Y;
    dVar3 = (this->super_AActor).radius;
    obj = &(this->super_AActor).target;
    pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar10 != (AActor *)0x0) {
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      dVar4 = (pAVar10->Angles).Yaw.Degrees;
      dVar7 = fastsindeg(dVar4);
      dVar8 = fastcosdeg(dVar4);
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      dVar4 = (this->m_off).X;
      dVar5 = (this->m_off).Y;
      dVar6 = (this->m_off).Z;
      this_00 = GC::ReadBarrier<AActor>((AActor **)obj);
      dVar9 = AActor::GetBobOffset(this_00,0.0);
      AActor::Vec3Offset(&local_38,pAVar10,dVar5 * dVar7 + dVar4 * dVar8,
                         dVar4 * dVar7 - dVar5 * dVar8,dVar6 + dVar9,false);
      (this->super_AActor).__Pos.Z = local_38.Z;
      (this->super_AActor).__Pos.X = local_38.X;
      (this->super_AActor).__Pos.Y = local_38.Y;
      pAVar10 = GC::ReadBarrier<AActor>((AActor **)obj);
      (this->super_AActor).Prev.Z = (pAVar10->__Pos).Z;
      local_48.X = (pAVar10->__Pos).X;
      local_48.Y = (pAVar10->__Pos).Y;
      (this->super_AActor).Prev.X = local_48.X;
      (this->super_AActor).Prev.Y = local_48.Y;
      psVar11 = R_PointInSubsector(&local_48);
      this->subsector = psVar11;
      (this->super_AActor).Sector = psVar11->sector;
    }
    if ((byte)(this->lighttype - 1) < 3) {
      iVar12 = this->m_Radius[1];
      if (this->m_Radius[1] < this->m_Radius[0]) {
        iVar12 = this->m_Radius[0];
      }
      fVar13 = (float)iVar12;
    }
    else {
      fVar13 = this->m_currentRadius;
    }
    (this->super_AActor).radius = (double)(fVar13 + fVar13);
    if (((dVar1 != (this->super_AActor).__Pos.X) || (dVar2 != (this->super_AActor).__Pos.Y)) ||
       (dVar3 != (double)(fVar13 + fVar13))) {
      LinkLight(this);
    }
  }
  return;
}

Assistant:

bool IsActive() const { return !(flags2&MF2_DORMANT); }